

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pub.cpp
# Opt level: O0

void __thiscall
so_5::disp::adv_thread_pool::anon_unknown_6::proxy_dispatcher_t::~proxy_dispatcher_t
          (proxy_dispatcher_t *this)

{
  proxy_dispatcher_t *this_local;
  
  ~proxy_dispatcher_t(this);
  operator_delete(this);
  return;
}

Assistant:

proxy_dispatcher_t( disp_params_t params )
			:	proxy_dispatcher_base_t( std::move(params) )
			{}